

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemTable.cpp
# Opt level: O1

void __thiscall ItemTable::~ItemTable(ItemTable *this)

{
  _Rb_tree_node_base *p_Var1;
  ItemList *__range1;
  
  for (p_Var1 = (this->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->items)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    free(p_Var1[1]._M_parent);
  }
  std::
  _Rb_tree<itemType,_std::pair<const_itemType,_ItemWrapper_*>,_std::_Select1st<std::pair<const_itemType,_ItemWrapper_*>_>,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
  ::~_Rb_tree((_Rb_tree<itemType,_std::pair<const_itemType,_ItemWrapper_*>,_std::_Select1st<std::pair<const_itemType,_ItemWrapper_*>_>,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
               *)this);
  return;
}

Assistant:

ItemTable::~ItemTable(){
    for(auto i : items){
        free(i.second);
    }
}